

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
BooleanOpNode::Evaluate
          (string *__return_storage_ptr__,BooleanOpNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  pointer pbVar5;
  ostringstream e;
  undefined1 auStack_1f8 [8];
  cmGeneratorExpressionContext *local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  pbVar5 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1f0 = context;
  do {
    bVar2 = pbVar5 != pbVar1;
    if (!bVar2) {
LAB_004b62c6:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,this->successVal,(allocator<char> *)local_1a8);
      return __return_storage_ptr__;
    }
    iVar3 = std::__cxx11::string::compare((char *)pbVar5);
    if (iVar3 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,this->failureVal,(allocator<char> *)local_1a8);
LAB_004b62c0:
      if (bVar2) {
        return __return_storage_ptr__;
      }
      goto LAB_004b62c6;
    }
    iVar3 = std::__cxx11::string::compare((char *)pbVar5);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Parameters to $<",0x10);
      __s = this->op;
      if (__s == (char *)0x0) {
        std::ios::clear((int)(auStack_1f8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x50);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"> must resolve to either \'0\' or \'1\'.",0x24);
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1c8,content);
      std::__cxx11::stringbuf::str();
      reportError(local_1f0,&local_1c8,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      goto LAB_004b62c0;
    }
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker*) const override
  {
    for (std::string const& param : parameters) {
      if (param == this->failureVal) {
        return this->failureVal;
      }
      if (param != this->successVal) {
        std::ostringstream e;
        e << "Parameters to $<" << this->op;
        e << "> must resolve to either '0' or '1'.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }
    return this->successVal;
  }